

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

double __thiscall icu_63::CalendarAstronomer::getJulianCentury(CalendarAstronomer *this)

{
  UBool UVar1;
  double dVar2;
  
  UVar1 = uprv_isNaN_63(this->julianCentury);
  if (UVar1 == '\0') {
    dVar2 = this->julianCentury;
  }
  else {
    dVar2 = getJulianDay(this);
    dVar2 = (dVar2 + -2415020.0) / 36525.0;
    this->julianCentury = dVar2;
  }
  return dVar2;
}

Assistant:

double CalendarAstronomer::getJulianCentury() {
    if (isINVALID(julianCentury)) {
        julianCentury = (getJulianDay() - 2415020.0) / 36525.0;
    }
    return julianCentury;
}